

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trip.c
# Opt level: O0

feed_db_status_t store_trip_db(trip_t *record,feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  char local_f8 [8];
  char qr [198];
  sqlite3_stmt *local_28;
  sqlite3_stmt *stmt;
  feed_db_t *db_local;
  trip_t *record_local;
  
  stmt = (sqlite3_stmt *)db;
  db_local = (feed_db_t *)record;
  memcpy(local_f8,
         "INSERT INTO trips (route_id, service_id, trip_id,trip_headsign, trip_short_name,direction_id, block_id, shape_id,wheelchair_accessible, bikes_allowed) values (?1, ?2, ?3,?4, ?5,?6, ?7, ?8,?9, ?10);"
         ,0xc6);
  sqlite3_prepare_v2(*(sqlite3 **)(stmt + 8),local_f8,-1,&local_28,(char **)0x0);
  sqlite3_bind_text(local_28,1,(char *)db_local,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_28,2,(char *)&db_local[1].rc,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_28,3,(char *)&db_local[3].conn,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_28,4,(char *)&db_local[4].in_transaction,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_28,5,(char *)&db_local[6].error_msg,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_int(local_28,6,*(int *)&db_local[8].path);
  sqlite3_bind_text(local_28,7,(char *)((long)&db_local[8].path + 4),-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_28,8,(char *)&db_local[9].open,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_int(local_28,9,*(int *)((long)&db_local[0xb].conn + 4));
  sqlite3_bind_int(local_28,10,*(int *)&db_local[0xb].error_msg);
  iVar1 = sqlite3_step(local_28);
  *(int *)(stmt + 0x18) = iVar1;
  iVar1 = *(int *)(stmt + 0x18);
  if (iVar1 == 0x65) {
    sqlite3_finalize(local_28);
  }
  else {
    pcVar2 = sqlite3_errmsg(*(sqlite3 **)(stmt + 8));
    pcVar2 = strdup(pcVar2);
    *(char **)(stmt + 0x10) = pcVar2;
    sqlite3_finalize(local_28);
  }
  record_local._4_4_ = (feed_db_status_t)(iVar1 == 0x65);
  return record_local._4_4_;
}

Assistant:

feed_db_status_t store_trip_db(trip_t *record, feed_db_t *db) {
    sqlite3_stmt *stmt;
    char qr[] = "INSERT INTO trips ("
                    "route_id, service_id, trip_id,"
                    "trip_headsign, trip_short_name,"
                    "direction_id, block_id, shape_id,"
                    "wheelchair_accessible, bikes_allowed"
                ") values ("
                    "?1, ?2, ?3,"
                    "?4, ?5,"
                    "?6, ?7, ?8,"
                    "?9, ?10"
                ");";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    sqlite3_bind_text(stmt, 1, record->route_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 2, record->service_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 3, record->id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 4, record->headsign, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 5, record->short_name, -1, SQLITE_STATIC);
    sqlite3_bind_int(stmt, 6, record->direction_id);
    sqlite3_bind_text(stmt, 7, record->block_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 8, record->shape_id, -1, SQLITE_STATIC);
    sqlite3_bind_int(stmt, 9, (int)record->wheelchair_accessible);
    sqlite3_bind_int(stmt, 10, (int)record->bikes_allowed);

    db->rc = sqlite3_step(stmt);
    if (db->rc != SQLITE_DONE) {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
        sqlite3_finalize(stmt);
        return FEED_DB_ERROR;
    }

    sqlite3_finalize(stmt);
    return FEED_DB_SUCCESS;
}